

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

cmValue __thiscall cmSourceFile::GetPropertyForUser(cmSourceFile *this,string *prop)

{
  __type _Var1;
  bool bVar2;
  PolicyStatus PVar3;
  PolicyStatus PVar4;
  string *value;
  cmMakefile *pcVar5;
  bool local_3b;
  bool local_39;
  bool cmp0118new;
  bool cmp0163new;
  PolicyStatus cmp0118;
  PolicyStatus cmp0163;
  string *prop_local;
  cmSourceFile *this_local;
  
  _Var1 = std::operator==(prop,&propLOCATION_abi_cxx11_);
  if (_Var1) {
    ResolveFullPath(this,(string *)0x0,(string *)0x0);
  }
  _Var1 = std::operator==(prop,&propLANGUAGE_abi_cxx11_);
  if (_Var1) {
    value = GetOrDetermineLanguage_abi_cxx11_(this);
    cmValue::cmValue((cmValue *)&this_local,value);
  }
  else {
    _Var1 = std::operator==(prop,&propGENERATED_abi_cxx11_);
    if (_Var1) {
      pcVar5 = cmSourceFileLocation::GetMakefile(&this->Location);
      PVar3 = cmMakefile::GetPolicyStatus(pcVar5,CMP0163,false);
      pcVar5 = cmSourceFileLocation::GetMakefile(&this->Location);
      PVar4 = cmMakefile::GetPolicyStatus(pcVar5,CMP0118,false);
      local_39 = PVar3 < NEW;
      local_3b = true;
      if (local_39) {
        local_3b = WARN < PVar4;
      }
      bVar2 = GetIsGenerated(this,(uint)!local_3b);
      if (bVar2) {
        cmValue::cmValue((cmValue *)&this_local,&propTRUE_abi_cxx11_);
      }
      else {
        cmValue::cmValue((cmValue *)&this_local,&propFALSE_abi_cxx11_);
      }
    }
    else {
      this_local = (cmSourceFile *)GetProperty(this,prop);
    }
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmSourceFile::GetPropertyForUser(const std::string& prop)
{
  // This method is a consequence of design history and backwards
  // compatibility.  GetProperty is (and should be) a const method.
  // Computed properties should not be stored back in the property map
  // but instead reference information already known.  If they need to
  // cache information in a mutable ivar to provide the return string
  // safely then so be it.
  //
  // The LOCATION property is particularly problematic.  The CMake
  // language has very loose restrictions on the names that will match
  // a given source file (for historical reasons).  Implementing
  // lookups correctly with such loose naming requires the
  // cmSourceFileLocation class to commit to a particular full path to
  // the source file as late as possible.  If the users requests the
  // LOCATION property we must commit now.
  if (prop == propLOCATION) {
    // Commit to a location.
    this->ResolveFullPath();
  }

  // Similarly, LANGUAGE can be determined by the file extension
  // if it is requested by the user.
  if (prop == propLANGUAGE) {
    // The pointer is valid until `this->Language` is modified.
    return cmValue(this->GetOrDetermineLanguage());
  }

  // Special handling for GENERATED property.
  if (prop == propGENERATED) {
    // We need to check policy CMP0163 and CMP0118 in order to determine if we
    // need to possibly consider the value of a locally set GENERATED property,
    // too.
    auto cmp0163 =
      this->Location.GetMakefile()->GetPolicyStatus(cmPolicies::CMP0163);
    auto cmp0118 =
      this->Location.GetMakefile()->GetPolicyStatus(cmPolicies::CMP0118);
    bool const cmp0163new =
      cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
    bool const cmp0118new = cmp0163new ||
      (cmp0118 != cmPolicies::OLD && cmp0118 != cmPolicies::WARN);
    if (this->GetIsGenerated((!cmp0118new) ? CheckScope::GlobalAndLocal
                                           : CheckScope::Global)) {
      return cmValue(propTRUE);
    }
    return cmValue(propFALSE);
  }

  // Perform the normal property lookup.
  return this->GetProperty(prop);
}